

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

Value * system_function_number(Value *context_value,TupleValue *parameter_values)

{
  Value *value_00;
  longlong val;
  longdouble in_ST0;
  double dVar1;
  double dVar2;
  longdouble float_value;
  Value *value;
  TupleValue *parameter_values_local;
  Value *context_value_local;
  
  if (parameter_values->length == 0) {
    context_value_local = new_null_value();
  }
  else {
    value_00 = *parameter_values->items;
    if ((value_00->value_type == ValueTypeIntegerValue) ||
       (value_00->value_type == ValueTypeFloatValue)) {
      context_value_local = copy_value(value_00);
    }
    else if (value_00->value_type == ValueTypeStringValue) {
      strtold(*(char **)(value_00 + 1),(char **)0x0);
      dVar1 = ceil((double)in_ST0);
      dVar2 = floor((double)in_ST0);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        context_value_local = new_float_value(in_ST0);
      }
      else {
        context_value_local = new_integer_value((long)ROUND(in_ST0));
      }
    }
    else {
      val = convert_to_integer(value_00);
      context_value_local = new_integer_value(val);
    }
  }
  return context_value_local;
}

Assistant:

Value *system_function_number(Value *context_value, TupleValue *parameter_values) {
  if (parameter_values->length == 0) return new_null_value();

  Value *value = parameter_values->items[0];

  if (value->value_type == ValueTypeIntegerValue || value->value_type == ValueTypeFloatValue) {
    return copy_value(value);
  }
  else if (value->value_type == ValueTypeStringValue) {
    long double float_value = strtold(((StringValue *) value)->string_value, NULL);

    if (ceil(float_value) == floor(float_value)) {
      return new_integer_value((long long int) float_value);
    }
    else {
      return new_float_value(float_value);
    }
  }

  return new_integer_value(convert_to_integer(value));
}